

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O0

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)

{
  int iVar1;
  int *piVar2;
  CP_PeerConnection *RetDataBlock;
  attr_list p_Var3;
  SstStream Stream_00;
  WS_ReaderInfo *pp_Var4;
  void **__ptr;
  void *__ptr_00;
  void *__ptr_01;
  SstStream in_RDI;
  int i_1;
  _WriterResponseMsg response;
  _CP_DP_PairInfo **pointers;
  _CP_WriterInitInfo cpInfo;
  _CP_DP_PairInfo combined_init;
  int GlobalSuccess;
  int MySuccess;
  attr_list attrs;
  int i;
  CP_PeerConnection *connections_to_reader;
  void *ret_data_block;
  void *DP_WriterInfo;
  DP_WSR_Stream per_reader_Stream;
  _CombinedReaderInfo reader_data;
  WS_ReaderInfo CP_WSR_Stream;
  ssize_t GlobalStartingTimestep;
  ssize_t MyStartingTimestep;
  CMConnection conn;
  int WriterResponseCondition;
  void *free_block;
  reader_data_t ReturnData;
  RegisterQueue Req;
  int local_104;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  ssize_t in_stack_ffffffffffffff08;
  SstStream in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  void *in_stack_ffffffffffffff20;
  char *local_d0;
  CP_ReaderInitInfo *in_stack_ffffffffffffff38;
  FFSTypeHandle in_stack_ffffffffffffff40;
  WS_ReaderInfo in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar5;
  undefined4 in_stack_ffffffffffffff54;
  int local_9c;
  FFSTypeHandle in_stack_ffffffffffffff70;
  void *in_stack_ffffffffffffff78;
  int local_78 [2];
  CP_ReaderInitInfo *local_70;
  void **local_68;
  WS_ReaderInfo local_60;
  SpeculativePreloadMode local_58;
  WS_ReaderInfo local_50;
  ssize_t local_48;
  ssize_t local_40;
  CMConnection local_38;
  int local_2c;
  void *local_28;
  RegisterQueue __ptr_02;
  WS_ReaderInfo local_8;
  
  local_28 = (void *)0x0;
  local_2c = -1;
  local_38 = (CMConnection)0x0;
  local_50 = (WS_ReaderInfo)malloc(0x90);
  CP_verbose(in_RDI,PerRankVerbose,"Beginning writer-side reader open protocol\n");
  if (in_RDI->Rank == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    __ptr_02 = in_RDI->ReaderRegisterQueue;
    in_RDI->ReaderRegisterQueue = __ptr_02->Next;
    __ptr_02->Next = (_RegisterQueue *)0x0;
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    memset(local_78,0,0x28);
    local_78[0] = __ptr_02->Msg->ReaderCohortSize;
    local_70 = __ptr_02->Msg->CP_ReaderInfo;
    local_68 = __ptr_02->Msg->DP_ReaderInfo;
    local_60 = local_50;
    local_58 = __ptr_02->Msg->SpecPreload;
    piVar2 = (int *)CP_distributeDataFromRankZero
                              ((SstStream)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38);
    local_2c = __ptr_02->Msg->WriterResponseCondition;
    local_38 = __ptr_02->Conn;
    CMreturn_buffer(in_RDI->CPInfo->SharedCM->cm,__ptr_02->Msg);
    free(__ptr_02);
  }
  else {
    piVar2 = (int *)CP_distributeDataFromRankZero
                              ((SstStream)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                               in_stack_ffffffffffffff38);
  }
  RetDataBlock = (CP_PeerConnection *)calloc(0x18,(long)*piVar2);
  for (local_9c = 0; iVar1 = (int)((ulong)in_stack_ffffffffffffff40 >> 0x20), local_9c < *piVar2;
      local_9c = local_9c + 1) {
    p_Var3 = (attr_list)
             attr_list_from_string(**(undefined8 **)(*(long *)(piVar2 + 2) + (long)local_9c * 8));
    RetDataBlock[local_9c].ContactList = p_Var3;
    RetDataBlock[local_9c].RemoteStreamID =
         *(void **)(*(long *)(*(long *)(piVar2 + 2) + (long)local_9c * 8) + 8);
    if ((local_9c == 0) && (local_38 != (CMConnection)0x0)) {
      CMConnection_add_reference(local_38);
      RetDataBlock->CMconn = local_38;
      CMconn_register_close_handler(local_38,WriterConnCloseHandler,local_50);
    }
    else {
      RetDataBlock[local_9c].CMconn = (CMConnection)0x0;
    }
  }
  Stream_00 = (SstStream)
              (*in_RDI->DP_Interface->initWriterPerReader)
                        (&Svcs,in_RDI->DP_Stream,*piVar2,RetDataBlock,*(void ***)(piVar2 + 4),
                         (void **)&stack0xffffffffffffff78);
  memset(local_50,0,0x90);
  local_50->ReaderStatus = NotOpen;
  local_50->RankZeroID = *(void **)(piVar2 + 6);
  local_50->DP_WSR_Stream = Stream_00;
  local_50->ParentStream = in_RDI;
  local_50->LastReleasedTimestep = -1;
  local_50->Connections = RetDataBlock;
  local_50->LocalReaderDefinitionsLocked = 0;
  local_50->FullCommPatternLocked = 0;
  local_50->CommPatternLockTimestep = -1;
  local_50->ReaderStatus = Opening;
  if (piVar2[8] == 1) {
    local_50->PreloadMode = SstPreloadSpeculative;
    local_50->PreloadModeActiveTimestep = 0;
    CP_verbose(in_RDI,PerStepVerbose,"Setting SpeculativePreload ON for new reader\n");
  }
  iVar1 = initWSReader(in_stack_ffffffffffffff48,iVar1,in_stack_ffffffffffffff38);
  iVar5 = 0;
  SMPI_Allreduce(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                 (SMPI_Datatype)in_stack_ffffffffffffff10,
                 (SMPI_Op)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                 (SMPI_Comm)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (iVar5 == 0) {
    local_8 = (WS_ReaderInfo)0x0;
  }
  else {
    AddToLastCallFreeList((void *)0xf50ff6);
    free(local_28);
    pthread_mutex_lock((pthread_mutex_t *)&in_RDI->DataLock);
    pp_Var4 = (WS_ReaderInfo *)realloc(in_RDI->Readers,(long)(in_RDI->ReaderCount + 1) << 3);
    in_RDI->Readers = pp_Var4;
    in_RDI->Readers[in_RDI->ReaderCount] = local_50;
    in_RDI->ReaderCount = in_RDI->ReaderCount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&in_RDI->DataLock);
    memset(&local_d0,0,0x10);
    local_d0 = CP_GetContactString((SstStream)CONCAT44(iVar1,iVar5),
                                   (attr_list)in_stack_ffffffffffffff48);
    local_40 = earliestAvailableTimestepNumber(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (local_40 == -1) {
      local_40 = 0;
    }
    SMPI_Allreduce(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                   (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                   (SMPI_Datatype)in_stack_ffffffffffffff10,
                   (SMPI_Op)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                   (SMPI_Comm)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    CP_verbose(in_RDI,TraceVerbose,"My oldest timestep was %zd, global oldest timestep was %zd\n",
               local_40,local_48);
    local_50->StartingTimestep = local_48;
    __ptr = CP_consolidateDataToRankZero
                      (Stream_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                       &RetDataBlock->ContactList);
    if (in_RDI->Rank == 0) {
      memset(&stack0xffffffffffffff00,0,0x28);
      iVar1 = in_RDI->CohortSize;
      __ptr_00 = malloc((long)iVar1 << 3);
      __ptr_01 = malloc((long)iVar1 << 3);
      for (local_104 = 0; local_104 < iVar1; local_104 = local_104 + 1) {
        *(undefined8 *)((long)__ptr_00 + (long)local_104 * 8) = *__ptr[local_104];
        *(undefined8 *)((long)__ptr_01 + (long)local_104 * 8) =
             *(undefined8 *)((long)__ptr[local_104] + 8);
      }
      iVar1 = CMwrite(local_38,in_RDI->CPInfo->SharedCM->WriterResponseFormat,
                      &stack0xffffffffffffff00);
      if (iVar1 != 1) {
        CP_verbose(in_RDI,CriticalVerbose,
                   "Message failed to send to reader in participate in reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n"
                  );
      }
      free(__ptr_00);
      free(__ptr_01);
    }
    free(local_d0);
    if (in_stack_ffffffffffffff70 != (FFSTypeHandle)0x0) {
      free(in_stack_ffffffffffffff70);
    }
    if (__ptr != (void **)0x0) {
      free(__ptr);
    }
    CP_verbose(in_RDI,PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, reader ready response pending\n"
               ,local_50);
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

WS_ReaderInfo WriterParticipateInReaderOpen(SstStream Stream)
{
    RegisterQueue Req;
    reader_data_t ReturnData;
    void *free_block = NULL;
    int WriterResponseCondition = -1;
    CMConnection conn = NULL;
    ssize_t MyStartingTimestep, GlobalStartingTimestep;
    WS_ReaderInfo CP_WSR_Stream = malloc(sizeof(*CP_WSR_Stream));

    CP_verbose(Stream, PerRankVerbose, "Beginning writer-side reader open protocol\n");
    if (Stream->Rank == 0)
    {
        STREAM_MUTEX_LOCK(Stream);
        assert((Stream->ReaderRegisterQueue));
        Req = Stream->ReaderRegisterQueue;
        Stream->ReaderRegisterQueue = Req->Next;
        Req->Next = NULL;
        STREAM_MUTEX_UNLOCK(Stream);
        struct _CombinedReaderInfo reader_data;
        memset(&reader_data, 0, sizeof(reader_data));
        reader_data.ReaderCohortSize = Req->Msg->ReaderCohortSize;
        reader_data.CP_ReaderInfo = Req->Msg->CP_ReaderInfo;
        reader_data.DP_ReaderInfo = Req->Msg->DP_ReaderInfo;
        reader_data.RankZeroID = CP_WSR_Stream;
        reader_data.SpecPreload = Req->Msg->SpecPreload;
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &reader_data, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
        WriterResponseCondition = Req->Msg->WriterResponseCondition;
        conn = Req->Conn;
        CMreturn_buffer(Stream->CPInfo->SharedCM->cm, Req->Msg);
        free(Req);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedReaderInfoFormat, &free_block);
    }
    //    printf("I am writer rank %d, my info on readers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_reader_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    DP_WSR_Stream per_reader_Stream;
    void *DP_WriterInfo;
    void *ret_data_block;
    CP_PeerConnection *connections_to_reader;
    connections_to_reader = calloc(sizeof(CP_PeerConnection), ReturnData->ReaderCohortSize);
    for (int i = 0; i < ReturnData->ReaderCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_ReaderInfo[i]->ContactInfo);
        connections_to_reader[i].ContactList = attrs;
        connections_to_reader[i].RemoteStreamID = ReturnData->CP_ReaderInfo[i]->ReaderID;
        if ((i == 0) && (conn != NULL))
        {
            // reuse existing connection to reader rank 0
            // (only not NULL if this is writer rank 0)
            CMConnection_add_reference(conn);
            connections_to_reader[i].CMconn = conn;
            CMconn_register_close_handler(conn, WriterConnCloseHandler, (void *)CP_WSR_Stream);
        }
        else
        {
            connections_to_reader[i].CMconn = NULL;
        }
    }

    per_reader_Stream = Stream->DP_Interface->initWriterPerReader(
        &Svcs, Stream->DP_Stream, ReturnData->ReaderCohortSize, connections_to_reader,
        ReturnData->DP_ReaderInfo, &DP_WriterInfo);

    memset(CP_WSR_Stream, 0, sizeof(*CP_WSR_Stream));
    CP_WSR_Stream->ReaderStatus = NotOpen;
    CP_WSR_Stream->RankZeroID = ReturnData->RankZeroID;

    CP_WSR_Stream->DP_WSR_Stream = per_reader_Stream;
    CP_WSR_Stream->ParentStream = Stream;
    CP_WSR_Stream->LastReleasedTimestep = -1;
    CP_WSR_Stream->Connections = connections_to_reader;
    CP_WSR_Stream->LocalReaderDefinitionsLocked = 0;
    CP_WSR_Stream->FullCommPatternLocked = 0;
    CP_WSR_Stream->CommPatternLockTimestep = -1;
    CP_WSR_Stream->ReaderStatus = Opening;
    if (ReturnData->SpecPreload == SpecPreloadOn)
    {

        CP_WSR_Stream->PreloadMode = SstPreloadSpeculative;
        CP_WSR_Stream->PreloadModeActiveTimestep = 0;
        CP_verbose(Stream, PerStepVerbose, "Setting SpeculativePreload ON for new reader\n");
    }

    int MySuccess =
        initWSReader(CP_WSR_Stream, ReturnData->ReaderCohortSize, ReturnData->CP_ReaderInfo);

    int GlobalSuccess = 0;
    SMPI_Allreduce(&MySuccess, &GlobalSuccess, 1, SMPI_INT, SMPI_LAND, Stream->mpiComm);

    if (!GlobalSuccess)
    {
        return NULL;
    }
    AddToLastCallFreeList(CP_WSR_Stream);
    free(free_block);
    ReturnData = NULL; /* now invalid */

    STREAM_MUTEX_LOCK(Stream);
    Stream->Readers =
        realloc(Stream->Readers, sizeof(Stream->Readers[0]) * (Stream->ReaderCount + 1));
    Stream->Readers[Stream->ReaderCount] = CP_WSR_Stream;
    Stream->ReaderCount++;
    STREAM_MUTEX_UNLOCK(Stream);

    struct _CP_DP_PairInfo combined_init;
    struct _CP_WriterInitInfo cpInfo;

    struct _CP_DP_PairInfo **pointers = NULL;

    memset(&cpInfo, 0, sizeof(cpInfo));
    cpInfo.ContactInfo = CP_GetContactString(Stream, NULL);
    cpInfo.WriterID = CP_WSR_Stream;

    combined_init.CP_Info = (void **)&cpInfo;
    combined_init.DP_Info = DP_WriterInfo;

    MyStartingTimestep = earliestAvailableTimestepNumber(Stream, Stream->WriterTimestep);
    if (MyStartingTimestep == -1)
        MyStartingTimestep = 0;

    SMPI_Allreduce(&MyStartingTimestep, &GlobalStartingTimestep, 1, SMPI_LONG, SMPI_MAX,
                   Stream->mpiComm);

    CP_verbose(Stream, TraceVerbose, "My oldest timestep was %zd, global oldest timestep was %zd\n",
               MyStartingTimestep, GlobalStartingTimestep);

    CP_WSR_Stream->StartingTimestep = GlobalStartingTimestep;

    pointers = (struct _CP_DP_PairInfo **)CP_consolidateDataToRankZero(
        Stream, &combined_init, Stream->CPInfo->PerRankWriterInfoFormat, &ret_data_block);

    if (Stream->Rank == 0)
    {
        struct _WriterResponseMsg response;
        memset(&response, 0, sizeof(response));
        response.WriterResponseCondition = WriterResponseCondition;
        response.WriterCohortSize = Stream->CohortSize;
        response.WriterConfigParams = Stream->ConfigParams;
        response.NextStepNumber = GlobalStartingTimestep;
        response.CP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        response.DP_WriterInfo = malloc(response.WriterCohortSize * sizeof(void *));
        for (int i = 0; i < response.WriterCohortSize; i++)
        {
            response.CP_WriterInfo[i] = (struct _CP_WriterInitInfo *)pointers[i]->CP_Info;
            response.DP_WriterInfo[i] = pointers[i]->DP_Info;
        }
        STREAM_ASSERT_UNLOCKED(Stream);
        if (CMwrite(conn, Stream->CPInfo->SharedCM->WriterResponseFormat, &response) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to reader in participate in "
                       "reader open!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!!\n");
        }
        free(response.CP_WriterInfo);
        free(response.DP_WriterInfo);
    }
    free(cpInfo.ContactInfo);
    if (ret_data_block)
        free(ret_data_block);
    if (pointers)
        free(pointers);
    CP_verbose(Stream, PerStepVerbose,
               "Finish writer-side reader open protocol for reader %p, "
               "reader ready response pending\n",
               CP_WSR_Stream);
    return CP_WSR_Stream;
}